

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constants.cpp
# Opt level: O2

Instruction * __thiscall
spvtools::opt::analysis::ConstantManager::BuildInstructionAndAddToModule
          (ConstantManager *this,Constant *new_const,inst_iterator *pos,uint32_t type_id)

{
  uint32_t uVar1;
  DefUseManager *this_00;
  IRContext *inst;
  IRContext *local_38;
  iterator local_30;
  
  uVar1 = IRContext::TakeNextId(this->ctx_);
  if (uVar1 == 0) {
    inst = (IRContext *)0x0;
  }
  else {
    CreateInstruction((ConstantManager *)&stack0xffffffffffffffc8,(uint32_t)this,
                      (Constant *)(ulong)uVar1,(uint32_t)new_const);
    inst = local_38;
    if (local_38 != (IRContext *)0x0) {
      InstructionList::iterator::InsertBefore
                ((iterator *)&stack0xffffffffffffffd0,
                 (unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                  *)pos);
      (pos->super_iterator).node_ =
           ((local_30.node_)->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
      if ((this->ctx_->valid_analyses_ & kAnalysisBegin) != kAnalysisNone) {
        this_00 = IRContext::get_def_use_mgr(this->ctx_);
        DefUseManager::AnalyzeInstDefUse(this_00,(Instruction *)inst);
      }
      MapConstantToInst(this,new_const,(Instruction *)inst);
      if (local_38 != (IRContext *)0x0) {
        (*((IntrusiveNodeBase<spvtools::opt::Instruction> *)&local_38->syntax_context_)->
          _vptr_IntrusiveNodeBase[1])();
      }
    }
  }
  return (Instruction *)inst;
}

Assistant:

Instruction* ConstantManager::BuildInstructionAndAddToModule(
    const Constant* new_const, Module::inst_iterator* pos, uint32_t type_id) {
  // TODO(1841): Handle id overflow.
  uint32_t new_id = context()->TakeNextId();
  if (new_id == 0) {
    return nullptr;
  }

  auto new_inst = CreateInstruction(new_id, new_const, type_id);
  if (!new_inst) {
    return nullptr;
  }
  auto* new_inst_ptr = new_inst.get();
  *pos = pos->InsertBefore(std::move(new_inst));
  ++(*pos);
  if (context()->AreAnalysesValid(IRContext::Analysis::kAnalysisDefUse))
    context()->get_def_use_mgr()->AnalyzeInstDefUse(new_inst_ptr);
  MapConstantToInst(new_const, new_inst_ptr);
  return new_inst_ptr;
}